

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
::is_non_zero(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
              *this,ID_index rowIndex)

{
  node_ptr plVar1;
  pointer pEVar2;
  Column_support *pCVar3;
  node_ptr local_28;
  
  pCVar3 = &this->column_;
  local_28 = (node_ptr)pCVar3;
  do {
    plVar1 = (((type *)&local_28->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar1 == (node_ptr)pCVar3) break;
    local_28 = plVar1;
    pEVar2 = boost::intrusive::
             bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node<void_*>_*,_Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>
             ::to_value_ptr(&local_28);
  } while (pEVar2->rowIndex_ != rowIndex);
  return plVar1 != (node_ptr)pCVar3;
}

Assistant:

inline bool Intrusive_list_column<Master_matrix>::is_non_zero(ID_index rowIndex) const
{
  // could be changed to dichotomic search as column is ordered by row index,
  // but I am not sure if it is really worth it as there is no random access
  // and the columns should not be that long anyway.
  for (const Entry& entry : column_)
    if (entry.get_row_index() == rowIndex) return true;

  return false;
}